

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TypeAliasType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
          (BumpAllocator *this,char (*args) [6],SourceLocation *args_1)

{
  size_t sVar1;
  TypeAliasType *this_00;
  string_view name;
  
  this_00 = (TypeAliasType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TypeAliasType *)this->endPtr < this_00 + 1) {
    this_00 = (TypeAliasType *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  sVar1 = strlen(*args);
  name._M_str = *args;
  name._M_len = sVar1;
  ast::TypeAliasType::TypeAliasType(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }